

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O1

Ptr<CommandBuffer> __thiscall
myvk::CommandBuffer::Create
          (CommandBuffer *this,Ptr<CommandPool> *command_pool,VkCommandBufferLevel level)

{
  element_type *peVar1;
  PFN_vkAllocateCommandBuffers p_Var2;
  element_type *peVar3;
  int iVar4;
  VkResult VVar5;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Ptr<CommandBuffer> PVar7;
  shared_ptr<myvk::CommandBuffer> ret;
  VkCommandBufferAllocateInfo alloc_info;
  _func_int **local_58;
  element_type *peStack_50;
  VkCommandBufferAllocateInfo local_48;
  
  std::__shared_ptr<myvk::CommandBuffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::CommandBuffer>>
            ((__shared_ptr<myvk::CommandBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (allocator<myvk::CommandBuffer> *)&local_48);
  local_58[3] = (_func_int *)
                (command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 4),
             &(command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  p_Var2 = vkAllocateCommandBuffers;
  local_48.pNext = (void *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_48._4_4_ = 0;
  peVar1 = (command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.commandPool = peVar1->m_command_pool;
  local_48.commandBufferCount = 1;
  local_48.level = level;
  iVar4 = (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar5 = (*p_Var2)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x268),&local_48,
                    (VkCommandBuffer *)(local_58 + 5));
  peVar3 = peStack_50;
  if (VVar5 == VK_SUCCESS) {
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    peStack_50 = (element_type *)0x0;
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_58;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    local_58 = (_func_int **)0x0;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  _Var6._M_pi = extraout_RDX;
  if (peStack_50 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_50);
    _Var6._M_pi = extraout_RDX_00;
  }
  PVar7.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  PVar7.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<CommandBuffer>)
         PVar7.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<CommandBuffer> CommandBuffer::Create(const Ptr<CommandPool> &command_pool, VkCommandBufferLevel level) {
	auto ret = std::make_shared<CommandBuffer>();
	ret->m_command_pool_ptr = command_pool;

	VkCommandBufferAllocateInfo alloc_info = {};
	alloc_info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
	alloc_info.commandPool = command_pool->GetHandle();
	alloc_info.level = level;
	alloc_info.commandBufferCount = 1;

	if (vkAllocateCommandBuffers(command_pool->GetDevicePtr()->GetHandle(), &alloc_info, &ret->m_command_buffer) !=
	    VK_SUCCESS)
		return nullptr;
	return ret;
}